

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O0

void __thiscall
spdlog::details::registry::initialize_logger(registry *this,shared_ptr<spdlog::logger> *new_logger)

{
  bool bVar1;
  pointer pfVar2;
  logger *this_00;
  element_type *this_01;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
  new_logger_00;
  pointer ppVar3;
  long in_RDI;
  level_enum new_level;
  iterator it;
  lock_guard<std::mutex> lock;
  err_handler *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  level_enum log_level;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffff58;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffff60;
  shared_ptr<spdlog::logger> local_78;
  undefined4 in_stack_ffffffffffffffa0;
  level_enum lVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
  local_58 [2];
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *in_stack_ffffffffffffffb8;
  logger *in_stack_ffffffffffffffc0;
  undefined1 local_20 [32];
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
             ,(mutex_type *)in_stack_ffffffffffffff48);
  std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x186000);
  pfVar2 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                     ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                      0x186016);
  (*pfVar2->_vptr_formatter[3])(local_20);
  logger::set_formatter(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)0x18605e);
  if (bVar1) {
    std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x186071);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    logger::set_error_handler
              ((logger *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)0x1860a9);
  }
  this_00 = (logger *)(in_RDI + 0xb0);
  this_01 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x186127);
  logger::name_abi_cxx11_(this_01);
  local_58[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
               *)in_stack_ffffffffffffff48,(key_type *)0x18613c);
  new_logger_00._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
              *)in_stack_ffffffffffffff48);
  bVar1 = std::__detail::operator!=
                    (local_58,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                               *)&stack0xffffffffffffff98);
  if (bVar1) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_false,_true>
                           *)0x186182);
    log_level = ppVar3->second;
  }
  else {
    log_level = *(level_enum *)(in_RDI + 0xf0);
  }
  lVar4 = log_level;
  std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1861ac);
  logger::set_level(this_00,log_level);
  std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1861c2);
  logger::flush_on(this_00,log_level);
  if (*(long *)(in_RDI + 0x148) != 0) {
    std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1861ee);
    logger::enable_backtrace
              ((logger *)CONCAT44(log_level,in_stack_ffffffffffffff50),
               (size_t)in_stack_ffffffffffffff48);
  }
  if ((*(byte *)(in_RDI + 0x140) & 1) != 0) {
    std::shared_ptr<spdlog::logger>::shared_ptr
              ((shared_ptr<spdlog::logger> *)CONCAT44(log_level,in_stack_ffffffffffffff50),&local_78
              );
    register_logger_((registry *)CONCAT44(lVar4,in_stack_ffffffffffffffa0),
                     (shared_ptr<spdlog::logger> *)new_logger_00._M_cur);
    std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x186241);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x186270);
  return;
}

Assistant:

SPDLOG_INLINE void registry::initialize_logger(std::shared_ptr<logger> new_logger)
{
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    new_logger->set_formatter(formatter_->clone());

    if (err_handler_)
    {
        new_logger->set_error_handler(err_handler_);
    }

    // set new level according to previously configured level or default level
    auto it = log_levels_.find(new_logger->name());
    auto new_level = it != log_levels_.end() ? it->second : global_log_level_;
    new_logger->set_level(new_level);

    new_logger->flush_on(flush_level_);

    if (backtrace_n_messages_ > 0)
    {
        new_logger->enable_backtrace(backtrace_n_messages_);
    }

    if (automatic_registration_)
    {
        register_logger_(std::move(new_logger));
    }
}